

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

int libj1939_add_socket_to_epoll(int epoll_fd,int sock,uint32_t events)

{
  int iVar1;
  int iVar2;
  epoll_event ev;
  int local_1c;
  epoll_event local_18;
  
  local_18.data.fd = 0;
  local_18._4_4_ = sock;
  local_18.events = events;
  iVar1 = epoll_ctl(epoll_fd,1,sock,&local_18);
  iVar2 = 0;
  if (iVar1 < 0) {
    libj1939_add_socket_to_epoll_cold_1();
    iVar2 = local_1c;
  }
  return iVar2;
}

Assistant:

int libj1939_add_socket_to_epoll(int epoll_fd, int sock, uint32_t events)
{
	struct epoll_event ev = {0};
	int ret;

	ev.events = events;
	ev.data.fd = sock;

	ret = epoll_ctl(epoll_fd, EPOLL_CTL_ADD, sock, &ev);
	if (ret < 0) {
		ret = errno;
		pr_err("epoll_ctl(EPOLL_CTL_ADD): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}